

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void CreateSystem(ecs_iter_t *it)

{
  ecs_world_t *world;
  ecs_entity_t *peVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *ctx;
  long lVar5;
  
  world = it->world;
  peVar1 = it->entities;
  pvVar2 = ecs_column_w_size(it,8,1);
  pvVar3 = ecs_column_w_size(it,8,2);
  pvVar4 = ecs_column_w_size(it,8,3);
  if (0 < it->count) {
    lVar5 = 0;
    do {
      if (pvVar4 == (void *)0x0) {
        ctx = (void *)0x0;
      }
      else {
        ctx = *(void **)((long)pvVar4 + lVar5 * 8);
      }
      ecs_init_system(world,peVar1[lVar5],*(ecs_iter_action_t *)((long)pvVar3 + lVar5 * 8),
                      *(ecs_query_t **)((long)pvVar2 + lVar5 * 8),ctx);
      lVar5 = lVar5 + 1;
    } while (lVar5 < it->count);
  }
  return;
}

Assistant:

static
void CreateSystem(
    ecs_iter_t *it)
{
    ecs_world_t *world = it->world;
    ecs_entity_t *entities = it->entities;

    EcsQuery *query = ecs_column(it, EcsQuery, 1);
    EcsIterAction *action = ecs_column(it, EcsIterAction, 2);
    EcsContext *ctx = ecs_column(it, EcsContext, 3);
    
    int32_t i;
    for (i = 0; i < it->count; i ++) {
        ecs_entity_t e = entities[i];
        void *ctx_ptr = NULL;
        if (ctx) {
            ctx_ptr = (void*)ctx[i].ctx;
        }

        ecs_init_system(world, e, action[i].action, query[i].query, ctx_ptr);
    }
}